

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Date *this;
  int local_78;
  int local_74;
  undefined1 local_70 [4];
  int i;
  Vector<int> v_int;
  undefined1 local_50 [8];
  Vector<Date> v;
  Date d3;
  Date d2;
  Date d1;
  char **argv_local;
  int argc_local;
  
  Date::Date((Date *)&d2.month,0x7dc);
  Date::Date((Date *)&d3.month,0x7e4,7);
  this = (Date *)((long)&v.values + 4);
  Date::Date(this,0x7e4,10,0x1e);
  print((Date *)&d2.month);
  print((Date *)&d3.month);
  print(this);
  Vector<Date>::Vector((Vector<Date> *)local_50,3);
  print<Date>((Vector<Date> *)local_50);
  Vector<Date>::set((Vector<Date> *)local_50,0,(Date *)&d2.month);
  Vector<Date>::set((Vector<Date> *)local_50,1,(Date *)&d3.month);
  Vector<Date>::set((Vector<Date> *)local_50,2,(Date *)((long)&v.values + 4));
  print<Date>((Vector<Date> *)local_50);
  Vector<int>::Vector((Vector<int> *)local_70,3);
  for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
    local_78 = local_74 + 1;
    Vector<int>::set((Vector<int> *)local_70,local_74,&local_78);
  }
  print<int>((Vector<int> *)local_70);
  Vector<int>::~Vector((Vector<int> *)local_70);
  Vector<Date>::~Vector((Vector<Date> *)local_50);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto d1 = Date(2012);
    auto d2 = Date(2020, 7);
    auto d3 = Date(2020, 10, 30);
    print(d1);
    print(d2);
    print(d3);

    auto v = Vector<Date>(3);
    print(v);
    v.set(0, d1);
    v.set(1, d2);
    v.set(2, d3);
    print(v);

    auto v_int = Vector<int>(3);
    for(int i=0; i<3; ++i)
        v_int.set(i, i+1);
    print(v_int);

    return 0;
}